

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O0

Regexp * re2::SimplifyWalker::SimplifyRepeat(Regexp *re,int min,int max,ParseFlags f)

{
  Regexp *pRVar1;
  Regexp **ppRVar2;
  ostream *poVar3;
  LogMessage *pLVar4;
  Regexp *pRVar5;
  int in_EDX;
  int in_ESI;
  int i_2;
  Regexp *suf;
  int i_1;
  PODArray<re2::Regexp_*> nre_subs_1;
  Regexp *nre;
  int i;
  PODArray<re2::Regexp_*> nre_subs;
  undefined8 in_stack_fffffffffffffd48;
  Regexp *in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd68;
  int len;
  PODArray<re2::Regexp_*> *in_stack_fffffffffffffd70;
  Regexp *in_stack_fffffffffffffd78;
  Regexp *in_stack_fffffffffffffd80;
  Regexp *in_stack_fffffffffffffd88;
  LogMessage *in_stack_fffffffffffffd90;
  Regexp *in_stack_fffffffffffffd98;
  string local_218 [32];
  LogMessage local_1f8;
  int local_74;
  Regexp *local_70;
  int local_64;
  Regexp *local_50;
  int local_34;
  int local_18;
  int local_14;
  Regexp *local_8;
  
  len = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  local_14 = in_ESI;
  if (in_EDX == -1) {
    if (in_ESI == 0) {
      Regexp::Incref(in_stack_fffffffffffffd88);
      local_8 = Regexp::Star(in_stack_fffffffffffffd50,
                             (ParseFlags)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    }
    else if (in_ESI == 1) {
      Regexp::Incref(in_stack_fffffffffffffd88);
      local_8 = Regexp::Plus(in_stack_fffffffffffffd50,
                             (ParseFlags)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    }
    else {
      PODArray<re2::Regexp_*>::PODArray(in_stack_fffffffffffffd70,len);
      for (local_34 = 0; local_34 < local_14 + -1; local_34 = local_34 + 1) {
        pRVar1 = Regexp::Incref(in_stack_fffffffffffffd88);
        ppRVar2 = PODArray<re2::Regexp_*>::operator[]
                            ((PODArray<re2::Regexp_*> *)in_stack_fffffffffffffd50,
                             (int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
        *ppRVar2 = pRVar1;
      }
      Regexp::Incref(in_stack_fffffffffffffd88);
      pRVar1 = Regexp::Plus(in_stack_fffffffffffffd50,
                            (ParseFlags)((ulong)in_stack_fffffffffffffd48 >> 0x20));
      ppRVar2 = PODArray<re2::Regexp_*>::operator[]
                          ((PODArray<re2::Regexp_*> *)in_stack_fffffffffffffd50,
                           (int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
      *ppRVar2 = pRVar1;
      PODArray<re2::Regexp_*>::data((PODArray<re2::Regexp_*> *)0x270590);
      local_8 = Regexp::Concat((Regexp **)in_stack_fffffffffffffd50,
                               (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                               (ParseFlags)in_stack_fffffffffffffd48);
      PODArray<re2::Regexp_*>::~PODArray((PODArray<re2::Regexp_*> *)0x2705d0);
    }
  }
  else if ((in_ESI == 0) && (in_EDX == 0)) {
    pRVar1 = (Regexp *)operator_new(0x28);
    Regexp::Regexp(in_stack_fffffffffffffd50,(RegexpOp)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                   (ParseFlags)in_stack_fffffffffffffd48);
    local_8 = pRVar1;
  }
  else if ((in_ESI == 1) && (in_EDX == 1)) {
    local_8 = Regexp::Incref(in_stack_fffffffffffffd88);
  }
  else {
    local_50 = (Regexp *)0x0;
    local_18 = in_EDX;
    if (0 < in_ESI) {
      PODArray<re2::Regexp_*>::PODArray(in_stack_fffffffffffffd70,len);
      for (local_64 = 0; local_64 < local_14; local_64 = local_64 + 1) {
        pRVar1 = Regexp::Incref(in_stack_fffffffffffffd88);
        in_stack_fffffffffffffd98 =
             (Regexp *)
             PODArray<re2::Regexp_*>::operator[]
                       ((PODArray<re2::Regexp_*> *)in_stack_fffffffffffffd50,
                        (int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
        *(Regexp **)in_stack_fffffffffffffd98 = pRVar1;
      }
      in_stack_fffffffffffffd90 =
           (LogMessage *)PODArray<re2::Regexp_*>::data((PODArray<re2::Regexp_*> *)0x27073f);
      in_stack_fffffffffffffd88 =
           Regexp::Concat((Regexp **)in_stack_fffffffffffffd50,
                          (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                          (ParseFlags)in_stack_fffffffffffffd48);
      local_50 = in_stack_fffffffffffffd88;
      PODArray<re2::Regexp_*>::~PODArray((PODArray<re2::Regexp_*> *)0x27077f);
    }
    if (local_14 < local_18) {
      Regexp::Incref(in_stack_fffffffffffffd88);
      local_70 = Regexp::Quest(in_stack_fffffffffffffd50,
                               (ParseFlags)((ulong)in_stack_fffffffffffffd48 >> 0x20));
      local_74 = local_14;
      while (local_74 = local_74 + 1, local_74 < local_18) {
        Regexp::Incref(in_stack_fffffffffffffd88);
        Concat2(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                (ParseFlags)((ulong)in_stack_fffffffffffffd70 >> 0x20));
        local_70 = Regexp::Quest(in_stack_fffffffffffffd50,
                                 (ParseFlags)((ulong)in_stack_fffffffffffffd48 >> 0x20));
      }
      if (local_50 == (Regexp *)0x0) {
        local_50 = local_70;
      }
      else {
        local_50 = Concat2(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                           (ParseFlags)((ulong)in_stack_fffffffffffffd70 >> 0x20));
      }
    }
    if (local_50 == (Regexp *)0x0) {
      pLVar4 = &local_1f8;
      LogMessage::LogMessage
                (in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,
                 (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      poVar3 = LogMessage::stream(pLVar4);
      poVar3 = std::operator<<(poVar3,"Malformed repeat ");
      Regexp::ToString_abi_cxx11_(in_stack_fffffffffffffd98);
      poVar3 = std::operator<<(poVar3,local_218);
      pLVar4 = (LogMessage *)std::operator<<(poVar3," ");
      poVar3 = (ostream *)std::ostream::operator<<(pLVar4,local_14);
      pRVar1 = (Regexp *)std::operator<<(poVar3," ");
      std::ostream::operator<<(pRVar1,local_18);
      std::__cxx11::string::~string(local_218);
      LogMessage::~LogMessage(pLVar4);
      pRVar5 = (Regexp *)operator_new(0x28);
      Regexp::Regexp(pRVar1,(RegexpOp)((ulong)pRVar5 >> 0x20),(ParseFlags)pRVar5);
      local_8 = pRVar5;
    }
    else {
      local_8 = local_50;
    }
  }
  return local_8;
}

Assistant:

Regexp* SimplifyWalker::SimplifyRepeat(Regexp* re, int min, int max,
                                       Regexp::ParseFlags f) {
  // x{n,} means at least n matches of x.
  if (max == -1) {
    // Special case: x{0,} is x*
    if (min == 0)
      return Regexp::Star(re->Incref(), f);

    // Special case: x{1,} is x+
    if (min == 1)
      return Regexp::Plus(re->Incref(), f);

    // General case: x{4,} is xxxx+
    PODArray<Regexp*> nre_subs(min);
    for (int i = 0; i < min-1; i++)
      nre_subs[i] = re->Incref();
    nre_subs[min-1] = Regexp::Plus(re->Incref(), f);
    return Regexp::Concat(nre_subs.data(), min, f);
  }

  // Special case: (x){0} matches only empty string.
  if (min == 0 && max == 0)
    return new Regexp(kRegexpEmptyMatch, f);

  // Special case: x{1} is just x.
  if (min == 1 && max == 1)
    return re->Incref();

  // General case: x{n,m} means n copies of x and m copies of x?.
  // The machine will do less work if we nest the final m copies,
  // so that x{2,5} = xx(x(x(x)?)?)?

  // Build leading prefix: xx.  Capturing only on the last one.
  Regexp* nre = NULL;
  if (min > 0) {
    PODArray<Regexp*> nre_subs(min);
    for (int i = 0; i < min; i++)
      nre_subs[i] = re->Incref();
    nre = Regexp::Concat(nre_subs.data(), min, f);
  }

  // Build and attach suffix: (x(x(x)?)?)?
  if (max > min) {
    Regexp* suf = Regexp::Quest(re->Incref(), f);
    for (int i = min+1; i < max; i++)
      suf = Regexp::Quest(Concat2(re->Incref(), suf, f), f);
    if (nre == NULL)
      nre = suf;
    else
      nre = Concat2(nre, suf, f);
  }

  if (nre == NULL) {
    // Some degenerate case, like min > max, or min < max < 0.
    // This shouldn't happen, because the parser rejects such regexps.
    LOG(DFATAL) << "Malformed repeat " << re->ToString() << " " << min << " " << max;
    return new Regexp(kRegexpNoMatch, f);
  }

  return nre;
}